

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * anon_unknown.dwarf_1a3010::CreateLogicalNot
                    (VmModule *module,SynBase *source,VmValue *value)

{
  bool bVar1;
  VmInstruction *pVVar2;
  VmType type;
  undefined7 in_stack_ffffffffffffffc8;
  bool bVar3;
  VmValue *value_local;
  SynBase *source_local;
  VmModule *module_local;
  
  bVar1 = VmType::operator==(&value->type,&VmType::Int);
  bVar3 = true;
  if (!bVar1) {
    bVar1 = VmType::operator==(&value->type,&VmType::Long);
    bVar3 = true;
    if (!bVar1) {
      bVar3 = (value->type).type == VM_TYPE_POINTER;
    }
  }
  if (bVar3 == false) {
    __assert_fail("value->type == VmType::Int || value->type == VmType::Long || value->type.type == VM_TYPE_POINTER"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x2c2,
                  "VmValue *(anonymous namespace)::CreateLogicalNot(VmModule *, SynBase *, VmValue *)"
                 );
  }
  type.structType = (TypeBase *)0x46;
  type._0_8_ = VmType::Int.structType;
  pVVar2 = CreateInstruction((anon_unknown_dwarf_1a3010 *)module,(VmModule *)source,
                             (SynBase *)VmType::Int._0_8_,type,(VmInstructionType)value,
                             (VmValue *)CONCAT17(bVar3,in_stack_ffffffffffffffc8));
  return &pVVar2->super_VmValue;
}

Assistant:

VmValue* CreateLogicalNot(VmModule *module, SynBase *source, VmValue *value)
	{
		assert(value->type == VmType::Int || value->type == VmType::Long || value->type.type == VM_TYPE_POINTER);

		return CreateInstruction(module, source, VmType::Int, VM_INST_LOG_NOT, value);
	}